

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

BuildValue * __thiscall
llbuild::buildsystem::ExternalCommand::computeCommandResult
          (BuildValue *__return_storage_ptr__,ExternalCommand *this,BuildSystem *system,
          TaskInterface ti)

{
  undefined8 this_00;
  bool bVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_01;
  reference ppBVar2;
  FileSystem *fileSystem;
  size_type sVar3;
  ExternalCommand *pEVar4;
  ArrayRef<llbuild::basic::FileInfo> outputInfos_00;
  ExternalCommand *local_478;
  ExternalCommand *local_460;
  ExternalCommand *local_450;
  ArrayRef<llbuild::basic::FileInfo> local_430;
  undefined1 local_420 [8];
  FileInfo info_1;
  uint64_t local_380;
  uint64_t local_378;
  uint64_t local_370;
  uint64_t local_368;
  uint64_t local_360;
  uint64_t local_358;
  uint8_t local_350;
  undefined1 local_34f [31];
  undefined1 local_330 [8];
  FileInfo info;
  BuildNode *node;
  iterator __end1;
  iterator __begin1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range1;
  SmallVector<llbuild::basic::FileInfo,_8U> outputInfos;
  BuildSystem *system_local;
  ExternalCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  pEVar4 = (ExternalCommand *)ti.impl;
  outputInfos.super_SmallVectorStorage<llbuild::basic::FileInfo,_8U>.InlineElts[7].
  super_AlignedCharArray<8UL,_80UL>.buffer._72_8_ = system;
  this_local = pEVar4;
  ti_local.ctx = __return_storage_ptr__;
  llvm::SmallVector<llbuild::basic::FileInfo,_8U>::SmallVector
            ((SmallVector<llbuild::basic::FileInfo,_8U> *)&__range1);
  this_01 = &(this->super_Command).outputs;
  __end1 = std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::begin(this_01);
  node = (BuildNode *)
         std::
         vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
         ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                     *)&node), bVar1) {
    ppBVar2 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&__end1);
    info.checksum.bytes._24_8_ = *ppBVar2;
    bVar1 = BuildNode::isCommandTimestamp((BuildNode *)info.checksum.bytes._24_8_);
    if (bVar1) {
      local_330 = (undefined1  [8])0x0;
      info.device = 0;
      info.inode = 0;
      info.mode = 0;
      info.size = 0;
      info.modTime.seconds = 0;
      info.modTime.nanoseconds._0_1_ = 0;
      local_450 = (ExternalCommand *)((long)&info.modTime.nanoseconds + 1);
      pEVar4 = (ExternalCommand *)(info.checksum.bytes + 0x18);
      do {
        *(undefined1 *)&(local_450->super_Command).super_JobDescriptor._vptr_JobDescriptor = 0;
        local_450 = (ExternalCommand *)
                    ((long)&(local_450->super_Command).super_JobDescriptor._vptr_JobDescriptor + 1);
      } while (local_450 != pEVar4);
      info.mode = core::TaskInterface::currentEpoch((TaskInterface *)&this_local);
      llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
                ((SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *)&__range1,
                 (FileInfo *)local_330);
    }
    else {
      bVar1 = BuildNode::isVirtual((BuildNode *)info.checksum.bytes._24_8_);
      this_00 = info.checksum.bytes._24_8_;
      if (bVar1) {
        local_380 = 0;
        local_378 = 0;
        local_370 = 0;
        local_368 = 0;
        local_360 = 0;
        local_358 = 0;
        local_350 = '\0';
        local_460 = (ExternalCommand *)local_34f;
        pEVar4 = (ExternalCommand *)local_330;
        do {
          *(undefined1 *)&(local_460->super_Command).super_JobDescriptor._vptr_JobDescriptor = 0;
          local_460 = (ExternalCommand *)
                      ((long)&(local_460->super_Command).super_JobDescriptor._vptr_JobDescriptor + 1
                      );
        } while (local_460 != pEVar4);
        llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
                  ((SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *)&__range1,
                   (FileInfo *)&stack0xfffffffffffffc80);
      }
      else {
        fileSystem = BuildSystem::getFileSystem
                               ((BuildSystem *)
                                outputInfos.super_SmallVectorStorage<llbuild::basic::FileInfo,_8U>.
                                InlineElts[7].super_AlignedCharArray<8UL,_80UL>.buffer._72_8_);
        BuildNode::getFileInfo
                  ((FileInfo *)(info_1.checksum.bytes + 0x18),(BuildNode *)this_00,fileSystem);
        llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
                  ((SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *)&__range1,
                   (FileInfo *)(info_1.checksum.bytes + 0x18));
      }
    }
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end1);
  }
  sVar3 = std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::size(&(this->super_Command).outputs);
  if (sVar3 == 0) {
    local_420 = (undefined1  [8])0x0;
    info_1.device = 0;
    info_1.inode = 0;
    info_1.mode = 0;
    info_1.size = 0;
    info_1.modTime.seconds = 0;
    info_1.modTime.nanoseconds._0_1_ = 0;
    local_478 = (ExternalCommand *)((long)&info_1.modTime.nanoseconds + 1);
    pEVar4 = (ExternalCommand *)(info_1.checksum.bytes + 0x18);
    do {
      *(undefined1 *)&(local_478->super_Command).super_JobDescriptor._vptr_JobDescriptor = 0;
      local_478 = (ExternalCommand *)
                  ((long)&(local_478->super_Command).super_JobDescriptor._vptr_JobDescriptor + 1);
    } while (local_478 != pEVar4);
    info_1.mode = core::TaskInterface::currentEpoch((TaskInterface *)&this_local);
    llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
              ((SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *)&__range1,
               (FileInfo *)local_420);
  }
  llvm::ArrayRef<llbuild::basic::FileInfo>::ArrayRef<void>
            (&local_430,(SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void> *)&__range1);
  outputInfos_00.Length = (size_type)pEVar4;
  outputInfos_00.Data = (FileInfo *)local_430.Length;
  BuildValue::makeSuccessfulCommand
            (__return_storage_ptr__,(BuildValue *)local_430.Data,outputInfos_00);
  llvm::SmallVector<llbuild::basic::FileInfo,_8U>::~SmallVector
            ((SmallVector<llbuild::basic::FileInfo,_8U> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

BuildValue
ExternalCommand::computeCommandResult(BuildSystem& system, core::TaskInterface ti) {
  // Capture the file information for each of the output nodes.
  //
  // FIXME: We need to delegate to the node here.
  SmallVector<FileInfo, 8> outputInfos;
  for (auto* node: outputs) {
    if (node->isCommandTimestamp()) {
      // FIXME: We currently have to shoehorn the timestamp into a fake file
      // info, but need to refactor the command result to just store the node
      // subvalues instead.
      FileInfo info{};
      info.size = ti.currentEpoch();
      outputInfos.push_back(info);
    } else if (node->isVirtual()) {
      outputInfos.push_back(FileInfo{});
    } else {
      outputInfos.push_back(node->getFileInfo(
                                system.getFileSystem()));
    }
  }

  // FIXME: If the outputs are empty, it might mean that this instance is for a custom task, which does not
  // currently have any hooks for specifying what the outputs are. It might make sense to create a new BuildValue
  // for a successful command with custom data, so that we can avoid the file system for commands that don't require
  // the filesystem. For now, hackily insert the timestamp just to differentiate between 2 build values that ran at
  // different times.
  if (outputs.size() == 0) {
    FileInfo info{};
    info.size = ti.currentEpoch();
    outputInfos.push_back(info);
  }

  return BuildValue::makeSuccessfulCommand(outputInfos);
}